

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O0

void relax_from_v_sync(vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                       *adj_list,int relax_v,vector<int,_std::allocator<int>_> *dists)

{
  int iVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  int local_2c;
  int j;
  int weight;
  int to;
  vector<int,_std::allocator<int>_> *dists_local;
  int relax_v_local;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *adj_list_local;
  
  local_2c = 0;
  while( true ) {
    pvVar4 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[](adj_list,(long)relax_v);
    sVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(pvVar4);
    if (sVar5 <= (ulong)(long)local_2c) break;
    pvVar4 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[](adj_list,(long)relax_v);
    pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pvVar4,(long)local_2c);
    iVar1 = pvVar6->first;
    pvVar4 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[](adj_list,(long)relax_v);
    pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pvVar4,(long)local_2c);
    iVar2 = pvVar6->second;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](dists,(long)relax_v);
    iVar3 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](dists,(long)iVar1);
    if (iVar3 + iVar2 < *pvVar7) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](dists,(long)relax_v);
      iVar3 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](dists,(long)iVar1);
      *pvVar7 = iVar3 + iVar2;
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void relax_from_v_sync(const vector<vector<pair<int, int>>>& adj_list, int relax_v, vector<int>& dists){
    int to, weight;
    for (int j=0; j<adj_list[relax_v].size(); j++){
        to = adj_list[relax_v][j].first;
        weight = adj_list[relax_v][j].second;
        if (dists[relax_v] + weight < dists[to]){
            // Relax
            dists[to] = dists[relax_v] + weight;
        }
    }
}